

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_hadamard_lp_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *in_RDX;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i coeff3;
  __m128i coeff2;
  __m128i coeff1;
  __m128i coeff0;
  int idx_1;
  int16_t *t_coeff;
  int16_t *src_ptr;
  int idx;
  undefined8 local_2d8;
  undefined8 uStackY_2d0;
  undefined8 local_2c8;
  undefined8 uStackY_2c0;
  undefined8 local_2b8;
  undefined8 uStackY_2b0;
  undefined8 local_2a8;
  undefined8 uStackY_2a0;
  undefined8 local_298;
  undefined8 uStackY_290;
  undefined8 local_288;
  undefined8 uStackY_280;
  undefined8 local_278;
  undefined8 uStackY_270;
  undefined8 local_268;
  undefined8 uStackY_260;
  int16_t *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  int iVar13;
  int16_t *in_stack_fffffffffffffdb8;
  int local_234;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  
  for (local_234 = 0; local_234 < 4; local_234 = local_234 + 1) {
    hadamard_lp_8x8_sse2
              (in_stack_fffffffffffffdb8,
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8);
  }
  for (iVar13 = 0; iVar13 < 0x40; iVar13 = iVar13 + 8) {
    uVar1 = *in_RDX;
    uVar2 = in_RDX[1];
    uVar3 = in_RDX[0x10];
    uVar4 = in_RDX[0x11];
    uVar5 = in_RDX[0x20];
    uVar6 = in_RDX[0x21];
    uVar7 = in_RDX[0x30];
    uVar8 = in_RDX[0x31];
    local_1a8 = (short)uVar1;
    sStack_1a6 = (short)((ulong)uVar1 >> 0x10);
    sStack_1a4 = (short)((ulong)uVar1 >> 0x20);
    sStack_1a2 = (short)((ulong)uVar1 >> 0x30);
    sStack_1a0 = (short)uVar2;
    sStack_19e = (short)((ulong)uVar2 >> 0x10);
    sStack_19c = (short)((ulong)uVar2 >> 0x20);
    sStack_19a = (short)((ulong)uVar2 >> 0x30);
    local_1b8 = (short)uVar3;
    sStack_1b6 = (short)((ulong)uVar3 >> 0x10);
    sStack_1b4 = (short)((ulong)uVar3 >> 0x20);
    sStack_1b2 = (short)((ulong)uVar3 >> 0x30);
    sStack_1b0 = (short)uVar4;
    sStack_1ae = (short)((ulong)uVar4 >> 0x10);
    sStack_1ac = (short)((ulong)uVar4 >> 0x20);
    sStack_1aa = (short)((ulong)uVar4 >> 0x30);
    local_2a8._0_4_ = CONCAT22(sStack_1a6 + sStack_1b6,local_1a8 + local_1b8);
    local_2a8._0_6_ = CONCAT24(sStack_1a4 + sStack_1b4,(undefined4)local_2a8);
    local_2a8 = CONCAT26(sStack_1a2 + sStack_1b2,(undefined6)local_2a8);
    uStackY_2a0._0_2_ = sStack_1a0 + sStack_1b0;
    uStackY_2a0._2_2_ = sStack_19e + sStack_1ae;
    uStackY_2a0._4_2_ = sStack_19c + sStack_1ac;
    uStackY_2a0._6_2_ = sStack_19a + sStack_1aa;
    local_2b8._0_4_ = CONCAT22(sStack_1a6 - sStack_1b6,local_1a8 - local_1b8);
    local_2b8._0_6_ = CONCAT24(sStack_1a4 - sStack_1b4,(undefined4)local_2b8);
    local_2b8 = CONCAT26(sStack_1a2 - sStack_1b2,(undefined6)local_2b8);
    uStackY_2b0._0_2_ = sStack_1a0 - sStack_1b0;
    uStackY_2b0._2_2_ = sStack_19e - sStack_1ae;
    uStackY_2b0._4_2_ = sStack_19c - sStack_1ac;
    uStackY_2b0._6_2_ = sStack_19a - sStack_1aa;
    local_1c8 = (short)uVar5;
    sStack_1c6 = (short)((ulong)uVar5 >> 0x10);
    sStack_1c4 = (short)((ulong)uVar5 >> 0x20);
    sStack_1c2 = (short)((ulong)uVar5 >> 0x30);
    sStack_1c0 = (short)uVar6;
    sStack_1be = (short)((ulong)uVar6 >> 0x10);
    sStack_1bc = (short)((ulong)uVar6 >> 0x20);
    sStack_1ba = (short)((ulong)uVar6 >> 0x30);
    local_1d8 = (short)uVar7;
    sStack_1d6 = (short)((ulong)uVar7 >> 0x10);
    sStack_1d4 = (short)((ulong)uVar7 >> 0x20);
    sStack_1d2 = (short)((ulong)uVar7 >> 0x30);
    sStack_1d0 = (short)uVar8;
    sStack_1ce = (short)((ulong)uVar8 >> 0x10);
    sStack_1cc = (short)((ulong)uVar8 >> 0x20);
    sStack_1ca = (short)((ulong)uVar8 >> 0x30);
    local_2c8._0_4_ = CONCAT22(sStack_1c6 + sStack_1d6,local_1c8 + local_1d8);
    local_2c8._0_6_ = CONCAT24(sStack_1c4 + sStack_1d4,(undefined4)local_2c8);
    local_2c8 = CONCAT26(sStack_1c2 + sStack_1d2,(undefined6)local_2c8);
    uStackY_2c0._0_2_ = sStack_1c0 + sStack_1d0;
    uStackY_2c0._2_2_ = sStack_1be + sStack_1ce;
    uStackY_2c0._4_2_ = sStack_1bc + sStack_1cc;
    uStackY_2c0._6_2_ = sStack_1ba + sStack_1ca;
    local_2d8._0_4_ = CONCAT22(sStack_1c6 - sStack_1d6,local_1c8 - local_1d8);
    local_2d8._0_6_ = CONCAT24(sStack_1c4 - sStack_1d4,(undefined4)local_2d8);
    local_2d8 = CONCAT26(sStack_1c2 - sStack_1d2,(undefined6)local_2d8);
    uStackY_2d0._0_2_ = sStack_1c0 - sStack_1d0;
    uStackY_2d0._2_2_ = sStack_1be - sStack_1ce;
    uStackY_2d0._4_2_ = sStack_1bc - sStack_1cc;
    uStackY_2d0._6_2_ = sStack_1ba - sStack_1ca;
    auVar9._8_8_ = uStackY_2a0;
    auVar9._0_8_ = local_2a8;
    auVar9 = psraw(auVar9,ZEXT416(1));
    auVar10._8_8_ = uStackY_2b0;
    auVar10._0_8_ = local_2b8;
    auVar10 = psraw(auVar10,ZEXT416(1));
    auVar11._8_8_ = uStackY_2c0;
    auVar11._0_8_ = local_2c8;
    auVar11 = psraw(auVar11,ZEXT416(1));
    auVar12._8_8_ = uStackY_2d0;
    auVar12._0_8_ = local_2d8;
    auVar12 = psraw(auVar12,ZEXT416(1));
    local_1e8 = auVar9._0_2_;
    sStack_1e6 = auVar9._2_2_;
    sStack_1e4 = auVar9._4_2_;
    sStack_1e2 = auVar9._6_2_;
    sStack_1e0 = auVar9._8_2_;
    sStack_1de = auVar9._10_2_;
    sStack_1dc = auVar9._12_2_;
    sStack_1da = auVar9._14_2_;
    local_1f8 = auVar11._0_2_;
    sStack_1f6 = auVar11._2_2_;
    sStack_1f4 = auVar11._4_2_;
    sStack_1f2 = auVar11._6_2_;
    sStack_1f0 = auVar11._8_2_;
    sStack_1ee = auVar11._10_2_;
    sStack_1ec = auVar11._12_2_;
    sStack_1ea = auVar11._14_2_;
    local_268 = CONCAT26(sStack_1e2 + sStack_1f2,
                         CONCAT24(sStack_1e4 + sStack_1f4,
                                  CONCAT22(sStack_1e6 + sStack_1f6,local_1e8 + local_1f8)));
    uStackY_260 = CONCAT26(sStack_1da + sStack_1ea,
                           CONCAT24(sStack_1dc + sStack_1ec,
                                    CONCAT22(sStack_1de + sStack_1ee,sStack_1e0 + sStack_1f0)));
    local_208 = auVar10._0_2_;
    sStack_206 = auVar10._2_2_;
    sStack_204 = auVar10._4_2_;
    sStack_202 = auVar10._6_2_;
    sStack_200 = auVar10._8_2_;
    sStack_1fe = auVar10._10_2_;
    sStack_1fc = auVar10._12_2_;
    sStack_1fa = auVar10._14_2_;
    local_218 = auVar12._0_2_;
    sStack_216 = auVar12._2_2_;
    sStack_214 = auVar12._4_2_;
    sStack_212 = auVar12._6_2_;
    sStack_210 = auVar12._8_2_;
    sStack_20e = auVar12._10_2_;
    sStack_20c = auVar12._12_2_;
    sStack_20a = auVar12._14_2_;
    local_278 = CONCAT26(sStack_202 + sStack_212,
                         CONCAT24(sStack_204 + sStack_214,
                                  CONCAT22(sStack_206 + sStack_216,local_208 + local_218)));
    uStackY_270 = CONCAT26(sStack_1fa + sStack_20a,
                           CONCAT24(sStack_1fc + sStack_20c,
                                    CONCAT22(sStack_1fe + sStack_20e,sStack_200 + sStack_210)));
    local_288 = CONCAT26(sStack_1e2 - sStack_1f2,
                         CONCAT24(sStack_1e4 - sStack_1f4,
                                  CONCAT22(sStack_1e6 - sStack_1f6,local_1e8 - local_1f8)));
    uStackY_280 = CONCAT26(sStack_1da - sStack_1ea,
                           CONCAT24(sStack_1dc - sStack_1ec,
                                    CONCAT22(sStack_1de - sStack_1ee,sStack_1e0 - sStack_1f0)));
    local_298 = CONCAT26(sStack_202 - sStack_212,
                         CONCAT24(sStack_204 - sStack_214,
                                  CONCAT22(sStack_206 - sStack_216,local_208 - local_218)));
    uStackY_290 = CONCAT26(sStack_1fa - sStack_20a,
                           CONCAT24(sStack_1fc - sStack_20c,
                                    CONCAT22(sStack_1fe - sStack_20e,sStack_200 - sStack_210)));
    *in_RDX = local_268;
    in_RDX[1] = uStackY_260;
    in_RDX[0x10] = local_278;
    in_RDX[0x11] = uStackY_270;
    in_RDX[0x20] = local_288;
    in_RDX[0x21] = uStackY_280;
    in_RDX[0x30] = local_298;
    in_RDX[0x31] = uStackY_290;
    in_RDX = in_RDX + 2;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    hadamard_lp_8x8_sse2(src_ptr, src_stride, coeff + idx * 64);
  }

  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 64; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 64));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 128));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 192));

    __m128i b0 = _mm_add_epi16(coeff0, coeff1);
    __m128i b1 = _mm_sub_epi16(coeff0, coeff1);
    __m128i b2 = _mm_add_epi16(coeff2, coeff3);
    __m128i b3 = _mm_sub_epi16(coeff2, coeff3);

    b0 = _mm_srai_epi16(b0, 1);
    b1 = _mm_srai_epi16(b1, 1);
    b2 = _mm_srai_epi16(b2, 1);
    b3 = _mm_srai_epi16(b3, 1);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);

    _mm_store_si128((__m128i *)t_coeff, coeff0);
    _mm_store_si128((__m128i *)(t_coeff + 64), coeff1);
    _mm_store_si128((__m128i *)(t_coeff + 128), coeff2);
    _mm_store_si128((__m128i *)(t_coeff + 192), coeff3);

    t_coeff += 8;
  }
}